

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall
QString::arg_impl(QString *__return_storage_ptr__,QString *this,qulonglong a,int fieldWidth,int base
                 ,QChar fillChar)

{
  Data *pDVar1;
  QStringView s;
  uint flags;
  QStringView s_00;
  QStringView arg;
  QStringView larg;
  int iVar2;
  NumberOptions NVar3;
  undefined4 extraout_var;
  QArrayData *data;
  char16_t *pcVar4;
  qsizetype qVar5;
  storage_type_conflict *psVar6;
  long in_FS_OFFSET;
  QLocale locale;
  QLocale local_78;
  QString local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pcVar4 = (this->d).ptr;
  s.m_data = (this->d).ptr;
  s.m_size = (this->d).size;
  findArgEscapes((ArgEscapeData *)&local_58,s);
  if (puStack_50 == (undefined1 *)0x0) {
    pDVar1 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = (this->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    flags = (uint)(fillChar.ucs == L'0') * 2;
    data = (QArrayData *)0x0;
    qVar5 = 0;
    psVar6 = (storage_type_conflict *)0x0;
    if ((long)local_48 < (long)puStack_50) {
      iVar2 = QLocaleData::c((void *)0x0,pcVar4);
      QLocaleData::unsLongLongToString
                (&local_70,(QLocaleData *)CONCAT44(extraout_var,iVar2),a,-1,base,fieldWidth,flags);
      data = &(local_70.d.d)->super_QArrayData;
      qVar5 = local_70.d.size;
      psVar6 = local_70.d.ptr;
    }
    if ((long)local_48 < 1) {
      local_70.d.ptr = (storage_type_conflict *)0x0;
      local_70.d.size = 0;
      local_70.d.d = (Data *)0x0;
    }
    else {
      local_78.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QLocale::QLocale(&local_78);
      NVar3 = QLocale::numberOptions(&local_78);
      if ((local_78.d.d.ptr != (totally_ordered_wrapper<QLocalePrivate_*>)0x0) &&
         ((((QBasicAtomicInt *)((long)local_78.d.d.ptr + 8))->_q_value).super___atomic_base<int>.
          _M_i != 1)) {
        QSharedDataPointer<QLocalePrivate>::detach_helper(&local_78.d);
      }
      QLocaleData::unsLongLongToString
                (&local_70,*(QLocaleData **)local_78.d.d.ptr,a,-1,base,fieldWidth,
                 (((uint)NVar3.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                         super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5 | flags) ^ 0x20);
      QLocale::~QLocale(&local_78);
    }
    s_00.m_data = (this->d).ptr;
    s_00.m_size = (this->d).size;
    arg.m_size = qVar5;
    arg.m_data = psVar6;
    larg.m_size = local_70.d.size;
    larg.m_data = local_70.d.ptr;
    replaceArgEscapes(__return_storage_ptr__,s_00,(ArgEscapeData *)&local_58,(long)fieldWidth,arg,
                      larg,fillChar);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::arg_impl(qulonglong a, int fieldWidth, int base, QChar fillChar) const
{
    ArgEscapeData d = findArgEscapes(*this);

    if (d.occurrences == 0) {
        qWarning("QString::arg: Argument missing: \"%ls\", %lld", qUtf16Printable(*this), a);
        return *this;
    }

    unsigned flags = QLocaleData::NoFlags;
    // ZeroPadded sorts out left-padding when the fill is zero, to the right of sign:
    if (fillChar == u'0')
        flags = QLocaleData::ZeroPadded;

    QString arg;
    if (d.occurrences > d.locale_occurrences) {
        arg = QLocaleData::c()->unsLongLongToString(a, -1, base, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || fieldWidth <= arg.size());
    }

    QString localeArg;
    if (d.locale_occurrences > 0) {
        QLocale locale;
        if (!(locale.numberOptions() & QLocale::OmitGroupSeparator))
            flags |= QLocaleData::GroupDigits;
        localeArg = locale.d->m_data->unsLongLongToString(a, -1, base, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || fieldWidth <= localeArg.size());
    }

    return replaceArgEscapes(*this, d, fieldWidth, arg, localeArg, fillChar);
}